

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svggeometryelement.cpp
# Opt level: O0

Rect __thiscall lunasvg::SVGEllipseElement::updateShape(SVGEllipseElement *this,Path *path)

{
  Rect RVar1;
  float rx_00;
  float ry_00;
  float cx_00;
  float cy_00;
  float cy;
  float cx;
  float ry;
  float rx;
  LengthContext lengthContext;
  Path *path_local;
  SVGEllipseElement *this_local;
  undefined8 local_10;
  
  lengthContext._8_8_ = path;
  LengthContext::LengthContext((LengthContext *)&ry,(SVGElement *)this,UserSpaceOnUse);
  rx_00 = LengthContext::valueForLength((LengthContext *)&ry,&this->m_rx);
  ry_00 = LengthContext::valueForLength((LengthContext *)&ry,&this->m_ry);
  if ((rx_00 <= 0.0) || (ry_00 <= 0.0)) {
    this_local = (SVGEllipseElement *)0x0;
    local_10._0_4_ = 0.0;
    local_10._4_4_ = 0.0;
  }
  else {
    cx_00 = LengthContext::valueForLength((LengthContext *)&ry,&this->m_cx);
    cy_00 = LengthContext::valueForLength((LengthContext *)&ry,&this->m_cy);
    Path::addEllipse((Path *)lengthContext._8_8_,cx_00,cy_00,rx_00,ry_00);
    Rect::Rect((Rect *)&this_local,cx_00 - rx_00,cy_00 - ry_00,rx_00 + rx_00,ry_00 + ry_00);
  }
  RVar1.w = (float)local_10;
  RVar1.h = local_10._4_4_;
  RVar1._0_8_ = this_local;
  return RVar1;
}

Assistant:

Rect SVGEllipseElement::updateShape(Path& path)
{
    LengthContext lengthContext(this);
    auto rx = lengthContext.valueForLength(m_rx);
    auto ry = lengthContext.valueForLength(m_ry);
    if(rx <= 0.f || ry <= 0.f) {
        return Rect::Empty;
    }

    auto cx = lengthContext.valueForLength(m_cx);
    auto cy = lengthContext.valueForLength(m_cy);
    path.addEllipse(cx, cy, rx, ry);
    return Rect(cx - rx, cy - ry, rx + rx, ry + ry);
}